

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing.cpp
# Opt level: O1

void execute_tests(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  FILE *__src;
  long *plVar7;
  istream *piVar8;
  ostream *poVar9;
  undefined8 *puVar10;
  uint uVar11;
  ulong uVar12;
  undefined8 *puVar13;
  size_type *psVar14;
  long lVar15;
  long *plVar16;
  ulong uVar17;
  uint uVar18;
  ulong *puVar19;
  uint uVar20;
  uint __uval_1;
  uint uVar21;
  uint uVar22;
  string out_line;
  string __str;
  string exp_line;
  uint __uval;
  string __str_2;
  ifstream expected_file;
  ifstream out_file;
  string local_588;
  undefined8 *local_568;
  undefined8 local_560;
  undefined8 local_558;
  undefined8 uStack_550;
  string local_548;
  ulong *local_528;
  long local_520;
  ulong local_518;
  long lStack_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  ulong local_4e8;
  ulong *local_4e0;
  long local_4d8;
  ulong local_4d0 [2];
  long *local_4c0;
  long local_4b8;
  long local_4b0;
  long lStack_4a8;
  long *local_4a0;
  long local_498;
  long local_490;
  long lStack_488;
  long *local_480;
  long local_478;
  long local_470;
  long lStack_468;
  ulong *local_460 [2];
  ulong local_450 [2];
  long local_440 [65];
  long local_238 [65];
  
  stop.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  fclose(_stdout);
  __src = fdopen(old_stdout,"w");
  memcpy(_stdout,__src,0xd8);
  std::ifstream::ifstream((istream *)local_238,(string *)&out_name_abi_cxx11_,_S_in);
  std::ifstream::ifstream(local_440,(string *)&expected_name_abi_cxx11_,_S_in);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    std::operator+(&local_508,"!! Problems reading from file \'",&out_name_abi_cxx11_);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_508);
    puVar19 = (ulong *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar19) {
      local_588.field_2._M_allocated_capacity = *puVar19;
      local_588.field_2._8_8_ = plVar7[3];
      local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
    }
    else {
      local_588.field_2._M_allocated_capacity = *puVar19;
      local_588._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_588._M_string_length = plVar7[1];
    *plVar7 = (long)puVar19;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    write_colored_text(&local_588,red);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_dataplus._M_p != &local_588.field_2) {
      operator_delete(local_588._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p);
    }
  }
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 == '\0') {
    std::operator+(&local_508,"!! Problems reading from file \'",&expected_name_abi_cxx11_);
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_508);
    puVar19 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar19) {
      local_588.field_2._M_allocated_capacity = *puVar19;
      local_588.field_2._8_8_ = puVar10[3];
      local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
    }
    else {
      local_588.field_2._M_allocated_capacity = *puVar19;
      local_588._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_588._M_string_length = puVar10[1];
    *puVar10 = puVar19;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    write_colored_text(&local_588,red);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_dataplus._M_p != &local_588.field_2) {
      operator_delete(local_588._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p);
    }
  }
  else if (cVar4 != '\0') {
    paVar1 = &local_588.field_2;
    local_588._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"\nExecuting tests:","");
    write_colored_text(&local_588,blue);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_dataplus._M_p != paVar1) {
      operator_delete(local_588._M_dataplus._M_p);
    }
    local_588._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"\n----------------\n","");
    write_colored_text(&local_588,blue);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_dataplus._M_p != paVar1) {
      operator_delete(local_588._M_dataplus._M_p);
    }
    uVar17 = 0;
    local_588._M_string_length = 0;
    local_588.field_2._M_allocated_capacity =
         local_588.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
    local_508._M_string_length = 0;
    local_508.field_2._M_local_buf[0] = '\0';
    paVar2 = &local_548.field_2;
    uVar18 = 0;
    local_588._M_dataplus._M_p = (pointer)paVar1;
    do {
      do {
        uVar12 = uVar17 & 0xffffffff;
        while( true ) {
          cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                  (char)(istream *)local_238);
          piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_238,(string *)&local_588,cVar4);
          if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) {
            goto LAB_001069e6;
          }
          cVar4 = std::ios::widen((char)*(undefined8 *)(local_440[0] + -0x18) + (char)local_440);
          piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_440,(string *)&local_508,cVar4);
          if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) == 0) break;
          local_548._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_548,"You produced at least one line to much of output: ","");
          write_colored_text(&local_548,red);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_548._M_dataplus._M_p != paVar2) {
            operator_delete(local_548._M_dataplus._M_p);
          }
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_588._M_dataplus._M_p,
                              local_588._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          uVar18 = uVar18 + 1;
        }
        uVar22 = (uint)uVar17;
        uVar17 = (ulong)(uVar22 + 1);
      } while ((local_588._M_string_length == local_508._M_string_length) &&
              ((local_588._M_string_length == 0 ||
               (iVar6 = bcmp(local_588._M_dataplus._M_p,local_508._M_dataplus._M_p,
                             local_588._M_string_length), iVar6 == 0))));
      uVar20 = 1;
      if (8 < uVar22) {
        uVar12 = uVar17;
        uVar22 = 4;
        do {
          uVar20 = uVar22;
          uVar21 = (uint)uVar12;
          if (uVar21 < 100) {
            uVar20 = uVar20 - 2;
            goto LAB_00106770;
          }
          if (uVar21 < 1000) {
            uVar20 = uVar20 - 1;
            goto LAB_00106770;
          }
          if (uVar21 < 10000) goto LAB_00106770;
          uVar12 = uVar12 / 10000;
          uVar22 = uVar20 + 4;
        } while (99999 < uVar21);
        uVar20 = uVar20 + 1;
      }
LAB_00106770:
      local_528 = &local_518;
      local_4e8 = uVar17;
      std::__cxx11::string::_M_construct((ulong)&local_528,(char)uVar20);
      uVar17 = local_4e8;
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_528,uVar20,(uint)local_4e8);
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_528,0,(char *)0x0,0x11912b);
      local_568 = &local_558;
      puVar13 = puVar10 + 2;
      if ((undefined8 *)*puVar10 == puVar13) {
        local_558 = *puVar13;
        uStack_550 = puVar10[3];
      }
      else {
        local_558 = *puVar13;
        local_568 = (undefined8 *)*puVar10;
      }
      local_560 = puVar10[1];
      *puVar10 = puVar13;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_568);
      psVar14 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_548.field_2._M_allocated_capacity = *psVar14;
        local_548.field_2._8_8_ = plVar7[3];
        local_548._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_548.field_2._M_allocated_capacity = *psVar14;
        local_548._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_548._M_string_length = plVar7[1];
      *plVar7 = (long)psVar14;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      write_colored_text(&local_548,red);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548._M_dataplus._M_p != paVar2) {
        operator_delete(local_548._M_dataplus._M_p);
      }
      if (local_568 != &local_558) {
        operator_delete(local_568);
      }
      if (local_528 != &local_518) {
        operator_delete(local_528);
      }
      local_548._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"Expected: ","");
      write_colored_text(&local_548,yellow);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548._M_dataplus._M_p != paVar2) {
        operator_delete(local_548._M_dataplus._M_p);
      }
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_508._M_dataplus._M_p,
                          local_508._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t",1);
      local_548._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"Your output: ","");
      write_colored_text(&local_548,cyan);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548._M_dataplus._M_p != paVar2) {
        operator_delete(local_548._M_dataplus._M_p);
      }
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_588._M_dataplus._M_p,
                          local_588._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      uVar18 = uVar18 + 1;
    } while( true );
  }
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_588,"-> Tests will be skipped !!\n","");
  write_colored_text(&local_588,red);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p == &local_588.field_2) goto LAB_00106ce5;
LAB_00106ce0:
  operator_delete(local_588._M_dataplus._M_p);
LAB_00106ce5:
  std::ifstream::close();
  std::ifstream::close();
  lVar15 = (long)stop.__d.__r - (long)start.__d.__r;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Execution time for actual code: ",0x20);
  if (0x7ce < lVar15 / 1000 + 999U) {
    poVar9 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\'",1);
  }
  poVar9 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," microseconds",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::ifstream::~ifstream(local_440);
  std::ifstream::~ifstream(local_238);
  return;
LAB_001069e6:
  cVar4 = std::ios::widen((char)*(undefined8 *)(local_440[0] + -0x18) + (char)local_440);
  piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)local_440,(string *)&local_508,cVar4);
  uVar22 = (uint)uVar12;
  if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) goto LAB_00106bfa;
  uVar21 = uVar22 + 1;
  uVar20 = 1;
  if (8 < uVar22) {
    uVar22 = uVar21;
    uVar11 = 4;
    do {
      uVar20 = uVar11;
      if (uVar22 < 100) {
        uVar20 = uVar20 - 2;
        goto LAB_00106a83;
      }
      if (uVar22 < 1000) {
        uVar20 = uVar20 - 1;
        goto LAB_00106a83;
      }
      if (uVar22 < 10000) goto LAB_00106a83;
      bVar3 = 99999 < uVar22;
      uVar22 = uVar22 / 10000;
      uVar11 = uVar20 + 4;
    } while (bVar3);
    uVar20 = uVar20 + 1;
  }
LAB_00106a83:
  local_528 = &local_518;
  std::__cxx11::string::_M_construct((ulong)&local_528,(char)uVar20);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_528,uVar20,uVar21);
  puVar10 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_528,0,(char *)0x0,0x119187);
  puVar13 = puVar10 + 2;
  if ((undefined8 *)*puVar10 == puVar13) {
    local_558 = *puVar13;
    uStack_550 = puVar10[3];
    local_568 = &local_558;
  }
  else {
    local_558 = *puVar13;
    local_568 = (undefined8 *)*puVar10;
  }
  local_560 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_568);
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  psVar14 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_548.field_2._M_allocated_capacity = *psVar14;
    local_548.field_2._8_8_ = puVar10[3];
  }
  else {
    local_548.field_2._M_allocated_capacity = *psVar14;
    local_548._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_548._M_string_length = puVar10[1];
  *puVar10 = psVar14;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  write_colored_text(&local_548,red);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p);
  }
  if (local_568 != &local_558) {
    operator_delete(local_568);
  }
  if (local_528 != &local_518) {
    operator_delete(local_528);
  }
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_508._M_dataplus._M_p,local_508._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  uVar18 = uVar18 + 1;
  uVar12 = (ulong)uVar21;
  goto LAB_001069e6;
LAB_00106bfa:
  uVar20 = 1;
  if ((int)uVar18 < 1) {
    if (9 < uVar22) {
      uVar18 = 4;
      do {
        uVar20 = uVar18;
        uVar21 = (uint)uVar12;
        if (uVar21 < 100) {
          uVar20 = uVar20 - 2;
          goto LAB_001072db;
        }
        if (uVar21 < 1000) {
          uVar20 = uVar20 - 1;
          goto LAB_001072db;
        }
        if (uVar21 < 10000) goto LAB_001072db;
        uVar12 = uVar12 / 10000;
        uVar18 = uVar20 + 4;
      } while (99999 < uVar21);
      uVar20 = uVar20 + 1;
    }
LAB_001072db:
    local_528 = &local_518;
    std::__cxx11::string::_M_construct((ulong)&local_528,(char)uVar20);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_528,uVar20,uVar22);
    puVar10 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_528,0,(char *)0x0,0x1191f3);
    local_568 = &local_558;
    puVar13 = puVar10 + 2;
    if ((undefined8 *)*puVar10 == puVar13) {
      local_558 = *puVar13;
      uStack_550 = puVar10[3];
    }
    else {
      local_558 = *puVar13;
      local_568 = (undefined8 *)*puVar10;
    }
    local_560 = puVar10[1];
    *puVar10 = puVar13;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_568);
    psVar14 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_548.field_2._M_allocated_capacity = *psVar14;
      local_548.field_2._8_8_ = puVar10[3];
      local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
    }
    else {
      local_548.field_2._M_allocated_capacity = *psVar14;
      local_548._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_548._M_string_length = puVar10[1];
    *puVar10 = psVar14;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    write_colored_text(&local_548,green);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548._M_dataplus._M_p != &local_548.field_2) {
      operator_delete(local_548._M_dataplus._M_p);
    }
    if (local_568 != &local_558) {
      operator_delete(local_568);
    }
    puVar19 = local_528;
    if (local_528 != &local_518) goto LAB_001072a3;
  }
  else {
    if (9 < uVar18) {
      uVar17 = (ulong)uVar18;
      uVar21 = 4;
      do {
        uVar20 = uVar21;
        uVar11 = (uint)uVar17;
        if (uVar11 < 100) {
          uVar20 = uVar20 - 2;
          goto LAB_00106e9b;
        }
        if (uVar11 < 1000) {
          uVar20 = uVar20 - 1;
          goto LAB_00106e9b;
        }
        if (uVar11 < 10000) goto LAB_00106e9b;
        uVar17 = uVar17 / 10000;
        uVar21 = uVar20 + 4;
      } while (99999 < uVar11);
      uVar20 = uVar20 + 1;
    }
LAB_00106e9b:
    local_460[0] = local_450;
    std::__cxx11::string::_M_construct((ulong)local_460,(char)uVar20);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_460[0],uVar20,uVar18);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)local_460,0,(char *)0x0,0x1191b0);
    local_4c0 = &local_4b0;
    plVar16 = plVar7 + 2;
    if ((long *)*plVar7 == plVar16) {
      local_4b0 = *plVar16;
      lStack_4a8 = plVar7[3];
    }
    else {
      local_4b0 = *plVar16;
      local_4c0 = (long *)*plVar7;
    }
    local_4b8 = plVar7[1];
    *plVar7 = (long)plVar16;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_4c0);
    plVar16 = plVar7 + 2;
    if ((long *)*plVar7 == plVar16) {
      local_490 = *plVar16;
      lStack_488 = plVar7[3];
      local_4a0 = &local_490;
    }
    else {
      local_490 = *plVar16;
      local_4a0 = (long *)*plVar7;
    }
    local_498 = plVar7[1];
    *plVar7 = (long)plVar16;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_4a0);
    plVar16 = plVar7 + 2;
    if ((long *)*plVar7 == plVar16) {
      local_470 = *plVar16;
      lStack_468 = plVar7[3];
      local_480 = &local_470;
    }
    else {
      local_470 = *plVar16;
      local_480 = (long *)*plVar7;
    }
    local_478 = plVar7[1];
    *plVar7 = (long)plVar16;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_480);
    local_528 = &local_518;
    puVar19 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar19) {
      local_518 = *puVar19;
      lStack_510 = plVar7[3];
    }
    else {
      local_518 = *puVar19;
      local_528 = (ulong *)*plVar7;
    }
    local_520 = plVar7[1];
    *plVar7 = (long)puVar19;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    uVar18 = 1;
    if (9 < uVar22) {
      uVar20 = 4;
      do {
        uVar18 = uVar20;
        uVar21 = (uint)uVar12;
        if (uVar21 < 100) {
          uVar18 = uVar18 - 2;
          goto LAB_001070b7;
        }
        if (uVar21 < 1000) {
          uVar18 = uVar18 - 1;
          goto LAB_001070b7;
        }
        if (uVar21 < 10000) goto LAB_001070b7;
        uVar12 = uVar12 / 10000;
        uVar20 = uVar18 + 4;
      } while (99999 < uVar21);
      uVar18 = uVar18 + 1;
    }
LAB_001070b7:
    local_4e0 = local_4d0;
    std::__cxx11::string::_M_construct((ulong)&local_4e0,(char)uVar18);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_4e0,uVar18,uVar22);
    uVar17 = 0xf;
    if (local_528 != &local_518) {
      uVar17 = local_518;
    }
    if (uVar17 < (ulong)(local_4d8 + local_520)) {
      uVar17 = 0xf;
      if (local_4e0 != local_4d0) {
        uVar17 = local_4d0[0];
      }
      if (uVar17 < (ulong)(local_4d8 + local_520)) goto LAB_0010713d;
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_4e0,0,(char *)0x0,(ulong)local_528);
    }
    else {
LAB_0010713d:
      puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_528,(ulong)local_4e0);
    }
    local_568 = &local_558;
    puVar13 = puVar10 + 2;
    if ((undefined8 *)*puVar10 == puVar13) {
      local_558 = *puVar13;
      uStack_550 = puVar10[3];
    }
    else {
      local_558 = *puVar13;
      local_568 = (undefined8 *)*puVar10;
    }
    local_560 = puVar10[1];
    *puVar10 = puVar13;
    puVar10[1] = 0;
    *(undefined1 *)puVar13 = 0;
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_568);
    psVar14 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_548.field_2._M_allocated_capacity = *psVar14;
      local_548.field_2._8_8_ = puVar10[3];
      local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
    }
    else {
      local_548.field_2._M_allocated_capacity = *psVar14;
      local_548._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_548._M_string_length = puVar10[1];
    *puVar10 = psVar14;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    write_colored_text(&local_548,magenta);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548._M_dataplus._M_p != &local_548.field_2) {
      operator_delete(local_548._M_dataplus._M_p);
    }
    if (local_568 != &local_558) {
      operator_delete(local_568);
    }
    if (local_4e0 != local_4d0) {
      operator_delete(local_4e0);
    }
    if (local_528 != &local_518) {
      operator_delete(local_528);
    }
    if (local_480 != &local_470) {
      operator_delete(local_480);
    }
    if (local_4a0 != &local_490) {
      operator_delete(local_4a0);
    }
    if (local_4c0 != &local_4b0) {
      operator_delete(local_4c0);
    }
    puVar19 = local_460[0];
    if (local_460[0] != local_450) {
LAB_001072a3:
      operator_delete(puVar19);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p == &local_588.field_2) goto LAB_00106ce5;
  goto LAB_00106ce0;
}

Assistant:

void execute_tests() {

    // Stop the timer:
    stop = chrono::high_resolution_clock::now();

    /*
     * Recreate the standard output to the terminal:
     * https://stackoverflow.com/questions/1908687/how-to-redirect-the-output-back-to-the-screen-after-freopenout-txt-a-stdo/1910044#1910044
     * Somehow, this only works once - the second time, the output didn't work anymore 
     *    (e.g., when I tried to call this file string_in_out_testing.cpp in a loop)
     */
    fclose(stdout);
    FILE *fp_out = fdopen(old_stdout, "w");    // Open old stdout as a stream
    // Reassign the terminal to stdin/stdout:
    *stdout = *fp_out;                          // NOLINT(misc-non-copyable-objects)

    /*
     * Recreate the standard input to the terminal.
     * DOESN'T YET WORK ?!   
     * (But this is not necessary for this project, except if I would want to run multiple times in a sequence)
     */
//    fclose(stdin);
//    FILE  *fp_in = fdopen(old_stdin, "r");  // Open old stdin as a stream
//    *stdin = *fp_in;                        // NOLINT(misc-non-copyable-objects)



    // Open 'out_name' and 'expected_name' for 'r'-access:
    // see https://www.tutorialspoint.com/cplusplus/cpp_files_streams.htm
    // ifstream ... : represents input file stream (for reading from files)
    // ofstream ... : represents output file stream (for creating and writing to files)
    // For comparing, you only need reading:
    ifstream out_file(out_name);
    ifstream expected_file(expected_name);

    bool skip_tests = false;
    if (!out_file.is_open()) {
        write_colored_text("!! Problems reading from file '" + out_name + "'\n");
        skip_tests = true;
    }
    if (!expected_file.is_open()) {
        write_colored_text("!! Problems reading from file '" + expected_name + "'\n");
        skip_tests = true;
    }

    // Run actual tests: do string-comparison line by line
    if (skip_tests) {
        write_colored_text("-> Tests will be skipped !!\n");
    } else {
        write_colored_text("\nExecuting tests:", blue);
        write_colored_text("\n----------------\n", blue);
//        cout << "\n----------------" << endl;
        int line_nr = 0, error_count = 0;
        string out_line, exp_line;

        while (getline(out_file, out_line)) {
            if (getline(expected_file, exp_line)) {
                line_nr++;
                /*
                 * NOTE: I wanted to compare the two string as described in
                 * various online resources, such as https://www.geeksforgeeks.org/stdstringcompare-in-c/
                 * With:
                 *      if (out_line.compare(exp_line) == 0)
                 * But CLion showed "Clang-Tidy: Do not use 'compare' to test equality of strings; use the string
                 *      equality operator instead"
                 *
                 * It seems the above construct would be great to see if a string is shorter or longer than the other:
                 *      int difference = out_line.compare(exp_line);
                 *
                 * But here, I only want to know if they are the same.
                 * -> after automatic refactoring
                 */
                if (out_line != exp_line) {
                    write_colored_text("Error: Line " + to_string(line_nr) + ":\t");
                    write_colored_text("Expected: ", yellow);
                    cout << exp_line << "\t";
                    write_colored_text("Your output: ", cyan);
                    cout << out_line << endl;
                    error_count++;
                }
            } else {
                write_colored_text("You produced at least one line to much of output: ");
                cout << out_line << endl;
                error_count++;
            }
        }

        // Check, if 'expected' has more lines than 'out':
        while (getline(expected_file, exp_line)) {
            line_nr++;
            write_colored_text("You failed to produce expected line " + to_string(line_nr) + ":  ");
            cout << exp_line << endl;
            error_count++;
        }

        if (error_count > 0) {
            write_colored_text(
                    "You produced " + to_string(error_count) + " wrong line" + (error_count == 1 ? "" : "s") +
                    " of totally " + to_string(line_nr) + " lines of expected output!\n",
                    magenta);
        } else {
            write_colored_text("Yes, no errors, all " + to_string(line_nr) + " lines of output are correct!\n",
                               green);
        }
    }

    out_file.close();
    expected_file.close();

    // Subtract stop and start time-points and cast it to required unit. 
    // Predefined units are: nanoseconds, microseconds, milliseconds, seconds, minutes, hours.
    // Use duration_cast() function: 
    long int micro = chrono::duration_cast<chrono::microseconds>(stop - start).count();
    long int milli = micro / 1000;
    micro %= 1000;
    cout << "Execution time for actual code: ";
    if (milli) cout << milli << "'";
    cout << micro << " microseconds" << endl;
}